

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::TrackEventConfig::operator==(TrackEventConfig *this,TrackEventConfig *other)

{
  __type_conflict4 _Var1;
  bool bVar2;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  if ((((((_Var1) &&
         (bVar2 = ::std::operator==(&this->disabled_categories_,&other->disabled_categories_), bVar2
         )) && (bVar2 = ::std::operator==(&this->enabled_categories_,&other->enabled_categories_),
               bVar2)) &&
       ((bVar2 = ::std::operator==(&this->disabled_tags_,&other->disabled_tags_), bVar2 &&
        (bVar2 = ::std::operator==(&this->enabled_tags_,&other->enabled_tags_), bVar2)))) &&
      ((this->disable_incremental_timestamps_ == other->disable_incremental_timestamps_ &&
       ((this->timestamp_unit_multiplier_ == other->timestamp_unit_multiplier_ &&
        (this->filter_debug_annotations_ == other->filter_debug_annotations_)))))) &&
     (this->enable_thread_time_sampling_ == other->enable_thread_time_sampling_)) {
    return this->filter_dynamic_event_names_ == other->filter_dynamic_event_names_;
  }
  return false;
}

Assistant:

bool TrackEventConfig::operator==(const TrackEventConfig& other) const {
  return unknown_fields_ == other.unknown_fields_
   && disabled_categories_ == other.disabled_categories_
   && enabled_categories_ == other.enabled_categories_
   && disabled_tags_ == other.disabled_tags_
   && enabled_tags_ == other.enabled_tags_
   && disable_incremental_timestamps_ == other.disable_incremental_timestamps_
   && timestamp_unit_multiplier_ == other.timestamp_unit_multiplier_
   && filter_debug_annotations_ == other.filter_debug_annotations_
   && enable_thread_time_sampling_ == other.enable_thread_time_sampling_
   && filter_dynamic_event_names_ == other.filter_dynamic_event_names_;
}